

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

string * __thiscall
foxxll::disk_config::fileio_string_abi_cxx11_(string *__return_storage_ptr__,disk_config *this)

{
  direct_type dVar1;
  runtime_error *this_00;
  long lVar2;
  char *pcVar3;
  ostringstream oss;
  ostringstream msg;
  string local_330 [32];
  ostringstream local_310 [112];
  ios_base local_2a0 [264];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_310);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,(this->io_impl)._M_dataplus._M_p,(this->io_impl)._M_string_length)
  ;
  if (this->autogrow == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310," autogrow=no",0xc);
  }
  if (this->delete_on_exit == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310," delete_on_exit",0xf);
  }
  dVar1 = this->direct;
  if (dVar1 == DIRECT_OFF) {
    lVar2 = 0xb;
    pcVar3 = " direct=off";
  }
  else {
    if (dVar1 == DIRECT_TRY) goto LAB_00146cfc;
    if (dVar1 != DIRECT_ON) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Error in ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"std::string foxxll::disk_config::fileio_string() const",0x36)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Invalid setting for \'direct\' option.",0x24);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_330);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar2 = 10;
    pcVar3 = " direct=on";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,pcVar3,lVar2);
LAB_00146cfc:
  if (this->flash == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310," flash",6);
  }
  if ((uint)this->queue < 0xfffffffe) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310," queue=",7);
    std::ostream::operator<<((ostream *)local_310,this->queue);
  }
  if (this->device_id != 0xffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310," devid=",7);
    std::ostream::_M_insert<unsigned_long>((ulong)local_310);
  }
  if (this->raw_device == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310," raw_device",0xb);
  }
  if (this->unlink_on_open == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310," unlink_on_open",0xf);
  }
  if (this->queue_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310," queue_length=",0xe);
    std::ostream::operator<<((ostream *)local_310,this->queue_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_310);
  std::ios_base::~ios_base(local_2a0);
  return __return_storage_ptr__;
}

Assistant:

std::string disk_config::fileio_string() const
{
    std::ostringstream oss;

    oss << io_impl;

    if (!autogrow)
        oss << " autogrow=no";

    if (delete_on_exit)
        oss << " delete_on_exit";

    // tristate direct variable: OFF, TRY, ON
    if (direct == DIRECT_OFF)
    {
        oss << " direct=off";
    }
    else if (direct == DIRECT_TRY)
    { } // silenced: oss << " direct=try";
    else if (direct == DIRECT_ON)
    {
        oss << " direct=on";
    }
    else
        FOXXLL_THROW(std::runtime_error, "Invalid setting for 'direct' option.");

    if (flash) {
        oss << " flash";
    }

    if (queue != file::DEFAULT_QUEUE && queue != file::DEFAULT_LINUXAIO_QUEUE) {
        oss << " queue=" << queue;
    }

    if (device_id != file::DEFAULT_DEVICE_ID) {
        oss << " devid=" << device_id;
    }

    if (raw_device) {
        oss << " raw_device";
    }

    if (unlink_on_open) {
        oss << " unlink_on_open";
    }

    if (queue_length != 0) {
        oss << " queue_length=" << queue_length;
    }

    return oss.str();
}